

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorAngle::IntLoadConstraint_C
          (ChShaftsMotorAngle *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  undefined1 auVar1 [16];
  Scalar *pSVar2;
  undefined3 in_register_00000009;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined8 in_XMM1_Qb;
  undefined1 auVar6 [16];
  double local_48;
  
  dVar4 = c;
  (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj
    [0x40])();
  dVar5 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
          ChTime;
  (*((this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_48 = ((dVar4 - dVar5) - this->rot_offset) * c;
  if (CONCAT31(in_register_00000009,do_clamp) != 0) {
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = recovery_clamp;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar3 = vxorpd_avx512vl(auVar1,auVar3);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_48;
    auVar3 = vmaxsd_avx(auVar6,auVar3);
    auVar3 = vminsd_avx(auVar3,auVar1);
    local_48 = auVar3._0_8_;
  }
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,(ulong)off_L)
  ;
  *pSVar2 = local_48 + *pSVar2;
  return;
}

Assistant:

void ChShaftsMotorAngle::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                        ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                        const double c,            // a scaling factor
                                        bool do_clamp,             // apply clamping to c*C?
                                        double recovery_clamp      // value for min/max clamping of c*C
                                        ) {
    double res = c * (GetMotorRot()  - this->f_rot->Get_y(this->GetChTime()) - this->rot_offset);

    if (do_clamp) {
        res = ChMin(ChMax(res, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L) += res;
}